

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O0

void __thiscall ScriptException::GetError(ScriptException *this,HRESULT *phr,EXCEPINFO *pei)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EXCEPINFO *pei_local;
  HRESULT *phr_local;
  ScriptException *this_local;
  
  if (phr == (HRESULT *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/screrror.cpp"
                       ,0xc9,"(phr)","phr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (*phr == -0x7999bffc) {
    if (-1 < (this->ei).scode) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/screrror.cpp"
                         ,0xcd,"(((HRESULT)(((HRESULT)(ei.scode)))<0))","FAILED(HR(ei.scode))");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (pei == (EXCEPINFO *)0x0) {
      *phr = (this->ei).scode;
    }
    else {
      *phr = -0x7ffdfff7;
      js_memcpy_s(pei,0x40,&this->ei,0x40);
      memset(&this->ei,0,0x40);
      if (pei->pfnDeferredFillIn != (_func_HRESULT_tagEXCEPINFO_ptr *)0x0) {
        (*pei->pfnDeferredFillIn)(pei);
        pei->pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
      }
    }
  }
  return;
}

Assistant:

void ScriptException::GetError(HRESULT *phr, EXCEPINFO *pei)
{
    Assert(phr);

    if (HR(SCRIPT_E_RECORDED) == *phr)
    {
        Assert(FAILED(HR(ei.scode)));
        if (nullptr == pei)
            *phr = HR(ei.scode);
        else
        {
            *phr = HR(DISP_E_EXCEPTION);
            js_memcpy_s(pei, sizeof(*pei), &ei, sizeof(*pei));
            memset(&ei, 0, sizeof(ei));
            if (nullptr != pei->pfnDeferredFillIn)
            {
                pei->pfnDeferredFillIn(pei);
                pei->pfnDeferredFillIn = nullptr;
            }
        }
    }
}